

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeFunction.cpp
# Opt level: O1

void __thiscall
Js::RuntimeFunction::MarkVisitKindSpecificPtrs(RuntimeFunction *this,SnapshotExtractor *extractor)

{
  Var var;
  int iVar1;
  Var local_20;
  Var revokableProxy;
  
  var = (this->functionNameId).ptr;
  if (var != (Var)0x0) {
    TTD::SnapshotExtractor::MarkVisitVar(extractor,var);
  }
  local_20 = (Var)0x0;
  iVar1 = (*(this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x14])
                    (this,this,0xd,&local_20,0,
                     (((((this->super_JavascriptFunction).super_DynamicObject.super_RecyclableObject
                         .type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                     scriptContext.ptr);
  if (iVar1 != 0) {
    TTD::SnapshotExtractor::MarkVisitVar(extractor,local_20);
  }
  return;
}

Assistant:

void RuntimeFunction::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
    {
        if(this->functionNameId != nullptr)
        {
            extractor->MarkVisitVar(this->functionNameId);
        }

        Var revokableProxy = nullptr;
        RuntimeFunction* function = const_cast<RuntimeFunction*>(this);
        if(function->GetInternalProperty(function, Js::InternalPropertyIds::RevocableProxy, &revokableProxy, nullptr, this->GetScriptContext()))
        {
            extractor->MarkVisitVar(revokableProxy);
        }
    }